

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blowfish_test.cc
# Opt level: O0

void __thiscall Blowfish_CBC_Test::TestBody(Blowfish_CBC_Test *this)

{
  bool bVar1;
  EVP_CIPHER_CTX *pEVar2;
  EVP_CIPHER *pEVar3;
  char *pcVar4;
  char *in_R9;
  AssertHelper local_468;
  Message local_460;
  Bytes local_458;
  Span<const_unsigned_char> local_448;
  Bytes local_438;
  undefined1 local_428 [8];
  AssertionResult gtest_ar_3;
  Message local_410;
  unsigned_long local_408;
  unsigned_long local_400;
  undefined1 local_3f8 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_3c8;
  Message local_3c0;
  int local_3b4;
  undefined1 local_3b0 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_380;
  Message local_378;
  int local_36c;
  undefined1 local_368 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_338;
  Message local_330;
  int local_324;
  undefined1 local_320 [8];
  AssertionResult gtest_ar__3;
  ScopedEVP_CIPHER_CTX decrypt_ctx;
  Message local_270;
  Span<const_unsigned_char> local_268;
  Bytes local_258;
  Span<const_unsigned_char> local_248;
  Bytes local_238;
  undefined1 local_228 [8];
  AssertionResult gtest_ar_1;
  Message local_210;
  unsigned_long local_208;
  unsigned_long local_200;
  undefined1 local_1f8 [8];
  AssertionResult gtest_ar;
  AssertHelper local_1c8;
  Message local_1c0;
  int local_1b4;
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_180;
  Message local_178;
  int local_16c;
  undefined1 local_168 [8];
  AssertionResult gtest_ar__1;
  string local_150;
  AssertHelper local_130;
  Message local_128;
  int local_11c;
  undefined1 local_118 [8];
  AssertionResult gtest_ar_;
  undefined1 local_f8 [8];
  ScopedEVP_CIPHER_CTX ctx;
  int final_bytes;
  int out_bytes;
  uint8_t out [24];
  ScopedTrace gtest_trace_103;
  BlowfishTestCase *test;
  BlowfishTestCase *__end1;
  BlowfishTestCase *__begin1;
  BlowfishTestCase (*__range1) [2];
  Blowfish_CBC_Test *pBStack_10;
  uint test_num;
  Blowfish_CBC_Test *this_local;
  
  __range1._4_4_ = 0;
  __end1 = kTests;
  pBStack_10 = this;
  while( true ) {
    if (__end1 == (BlowfishTestCase *)"17Blowfish_ECB_Test") {
      return;
    }
    __range1._4_4_ = __range1._4_4_ + 1;
    testing::ScopedTrace::ScopedTrace<unsigned_int>
              ((ScopedTrace *)(out + 0x17),
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/blowfish/blowfish_test.cc"
               ,0x67,(uint *)((long)&__range1 + 4));
    bssl::internal::
    StackAllocated<evp_cipher_ctx_st,_int,_&EVP_CIPHER_CTX_init,_&EVP_CIPHER_CTX_cleanup>::
    StackAllocated((StackAllocated<evp_cipher_ctx_st,_int,_&EVP_CIPHER_CTX_init,_&EVP_CIPHER_CTX_cleanup>
                    *)local_f8);
    pEVar2 = (EVP_CIPHER_CTX *)
             bssl::internal::
             StackAllocated<evp_cipher_ctx_st,_int,_&EVP_CIPHER_CTX_init,_&EVP_CIPHER_CTX_cleanup>::
             get((StackAllocated<evp_cipher_ctx_st,_int,_&EVP_CIPHER_CTX_init,_&EVP_CIPHER_CTX_cleanup>
                  *)local_f8);
    pEVar3 = EVP_bf_cbc();
    local_11c = EVP_EncryptInit_ex(pEVar2,pEVar3,(ENGINE *)0x0,__end1->key,__end1->iv);
    testing::AssertionResult::AssertionResult<int>
              ((AssertionResult *)local_118,&local_11c,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
    if (!bVar1) {
      testing::Message::Message(&local_128);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_150,(internal *)local_118,
                 (AssertionResult *)
                 "EVP_EncryptInit_ex(ctx.get(), EVP_bf_cbc(), nullptr, test.key, test.iv)","false",
                 "true",in_R9);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_130,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/blowfish/blowfish_test.cc"
                 ,0x6e,pcVar4);
      testing::internal::AssertHelper::operator=(&local_130,&local_128);
      testing::internal::AssertHelper::~AssertHelper(&local_130);
      std::__cxx11::string::~string((string *)&local_150);
      testing::Message::~Message(&local_128);
    }
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
    if (gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      pEVar2 = (EVP_CIPHER_CTX *)
               bssl::internal::
               StackAllocated<evp_cipher_ctx_st,_int,_&EVP_CIPHER_CTX_init,_&EVP_CIPHER_CTX_cleanup>
               ::get((StackAllocated<evp_cipher_ctx_st,_int,_&EVP_CIPHER_CTX_init,_&EVP_CIPHER_CTX_cleanup>
                      *)local_f8);
      local_16c = EVP_EncryptUpdate(pEVar2,(uchar *)&final_bytes,(int *)&ctx.ctx_.field_0x94,
                                    __end1->plaintext,0x10);
      testing::AssertionResult::AssertionResult<int>
                ((AssertionResult *)local_168,&local_16c,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
      if (!bVar1) {
        testing::Message::Message(&local_178);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__2.message_,(internal *)local_168,
                   (AssertionResult *)
                   "EVP_EncryptUpdate(ctx.get(), out, &out_bytes, test.plaintext, sizeof(test.plaintext))"
                   ,"false","true",in_R9);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_180,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/blowfish/blowfish_test.cc"
                   ,0x70,pcVar4);
        testing::internal::AssertHelper::operator=(&local_180,&local_178);
        testing::internal::AssertHelper::~AssertHelper(&local_180);
        std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
        testing::Message::~Message(&local_178);
      }
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
      if (gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ == 0) {
        pEVar2 = (EVP_CIPHER_CTX *)
                 bssl::internal::
                 StackAllocated<evp_cipher_ctx_st,_int,_&EVP_CIPHER_CTX_init,_&EVP_CIPHER_CTX_cleanup>
                 ::get((StackAllocated<evp_cipher_ctx_st,_int,_&EVP_CIPHER_CTX_init,_&EVP_CIPHER_CTX_cleanup>
                        *)local_f8);
        local_1b4 = EVP_EncryptFinal_ex(pEVar2,(uchar *)((long)&final_bytes +
                                                        (long)(int)ctx.ctx_._148_4_),
                                        &ctx.ctx_.poisoned);
        testing::AssertionResult::AssertionResult<int>
                  ((AssertionResult *)local_1b0,&local_1b4,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
        if (!bVar1) {
          testing::Message::Message(&local_1c0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar.message_,(internal *)local_1b0,
                     (AssertionResult *)
                     "EVP_EncryptFinal_ex(ctx.get(), out + out_bytes, &final_bytes)","false","true",
                     in_R9);
          pcVar4 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_1c8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/blowfish/blowfish_test.cc"
                     ,0x71,pcVar4);
          testing::internal::AssertHelper::operator=(&local_1c8,&local_1c0);
          testing::internal::AssertHelper::~AssertHelper(&local_1c8);
          std::__cxx11::string::~string((string *)&gtest_ar.message_);
          testing::Message::~Message(&local_1c0);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
        local_200 = (unsigned_long)(ctx.ctx_._148_4_ + ctx.ctx_.poisoned);
        local_208 = 0x18;
        testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                  ((EqHelper *)local_1f8,"static_cast<size_t>(out_bytes + final_bytes)",
                   "sizeof(test.cbc_ciphertext)",&local_200,&local_208);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f8);
        if (!bVar1) {
          testing::Message::Message(&local_210);
          pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1f8);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/blowfish/blowfish_test.cc"
                     ,0x73,pcVar4);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_1.message_,&local_210);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
          testing::Message::~Message(&local_210);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f8);
        bssl::Span<unsigned_char_const>::Span<24ul>
                  ((Span<unsigned_char_const> *)&local_248,&__end1->cbc_ciphertext);
        Bytes::Bytes(&local_238,local_248);
        bssl::Span<unsigned_char_const>::Span<24ul>
                  ((Span<unsigned_char_const> *)&local_268,(uchar (*) [24])&final_bytes);
        Bytes::Bytes(&local_258,local_268);
        testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                  ((EqHelper *)local_228,"Bytes(test.cbc_ciphertext)","Bytes(out)",&local_238,
                   &local_258);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_228);
        if (!bVar1) {
          testing::Message::Message(&local_270);
          pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_228);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&decrypt_ctx.ctx_.poisoned,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/blowfish/blowfish_test.cc"
                     ,0x74,pcVar4);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&decrypt_ctx.ctx_.poisoned,&local_270);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&decrypt_ctx.ctx_.poisoned)
          ;
          testing::Message::~Message(&local_270);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_228);
        bssl::internal::
        StackAllocated<evp_cipher_ctx_st,_int,_&EVP_CIPHER_CTX_init,_&EVP_CIPHER_CTX_cleanup>::
        StackAllocated((StackAllocated<evp_cipher_ctx_st,_int,_&EVP_CIPHER_CTX_init,_&EVP_CIPHER_CTX_cleanup>
                        *)&gtest_ar__3.message_);
        pEVar2 = (EVP_CIPHER_CTX *)
                 bssl::internal::
                 StackAllocated<evp_cipher_ctx_st,_int,_&EVP_CIPHER_CTX_init,_&EVP_CIPHER_CTX_cleanup>
                 ::get((StackAllocated<evp_cipher_ctx_st,_int,_&EVP_CIPHER_CTX_init,_&EVP_CIPHER_CTX_cleanup>
                        *)&gtest_ar__3.message_);
        pEVar3 = EVP_bf_cbc();
        local_324 = EVP_DecryptInit_ex(pEVar2,pEVar3,(ENGINE *)0x0,__end1->key,__end1->iv);
        testing::AssertionResult::AssertionResult<int>
                  ((AssertionResult *)local_320,&local_324,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_320);
        if (!bVar1) {
          testing::Message::Message(&local_330);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__4.message_,(internal *)local_320,
                     (AssertionResult *)
                     "EVP_DecryptInit_ex(decrypt_ctx.get(), EVP_bf_cbc(), nullptr, test.key, test.iv)"
                     ,"false","true",in_R9);
          pcVar4 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_338,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/blowfish/blowfish_test.cc"
                     ,0x78,pcVar4);
          testing::internal::AssertHelper::operator=(&local_338,&local_330);
          testing::internal::AssertHelper::~AssertHelper(&local_338);
          std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
          testing::Message::~Message(&local_330);
        }
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._5_3_ = 0;
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_320);
        if (gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ == 0) {
          pEVar2 = (EVP_CIPHER_CTX *)
                   bssl::internal::
                   StackAllocated<evp_cipher_ctx_st,_int,_&EVP_CIPHER_CTX_init,_&EVP_CIPHER_CTX_cleanup>
                   ::get((StackAllocated<evp_cipher_ctx_st,_int,_&EVP_CIPHER_CTX_init,_&EVP_CIPHER_CTX_cleanup>
                          *)&gtest_ar__3.message_);
          local_36c = EVP_DecryptUpdate(pEVar2,(uchar *)&final_bytes,(int *)&ctx.ctx_.field_0x94,
                                        __end1->cbc_ciphertext,0x18);
          testing::AssertionResult::AssertionResult<int>
                    ((AssertionResult *)local_368,&local_36c,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_368);
          if (!bVar1) {
            testing::Message::Message(&local_378);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar__5.message_,(internal *)local_368,
                       (AssertionResult *)
                       "EVP_DecryptUpdate(decrypt_ctx.get(), out, &out_bytes, test.cbc_ciphertext, sizeof(test.cbc_ciphertext))"
                       ,"false","true",in_R9);
            pcVar4 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_380,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/blowfish/blowfish_test.cc"
                       ,0x7b,pcVar4);
            testing::internal::AssertHelper::operator=(&local_380,&local_378);
            testing::internal::AssertHelper::~AssertHelper(&local_380);
            std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
            testing::Message::~Message(&local_378);
          }
          gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._5_3_ = 0;
          gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_368);
          if (gtest_ar__1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_4_ == 0) {
            pEVar2 = (EVP_CIPHER_CTX *)
                     bssl::internal::
                     StackAllocated<evp_cipher_ctx_st,_int,_&EVP_CIPHER_CTX_init,_&EVP_CIPHER_CTX_cleanup>
                     ::get((StackAllocated<evp_cipher_ctx_st,_int,_&EVP_CIPHER_CTX_init,_&EVP_CIPHER_CTX_cleanup>
                            *)&gtest_ar__3.message_);
            local_3b4 = EVP_DecryptFinal_ex(pEVar2,(uchar *)((long)&final_bytes +
                                                            (long)(int)ctx.ctx_._148_4_),
                                            &ctx.ctx_.poisoned);
            testing::AssertionResult::AssertionResult<int>
                      ((AssertionResult *)local_3b0,&local_3b4,(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3b0);
            if (!bVar1) {
              testing::Message::Message(&local_3c0);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar_2.message_,(internal *)local_3b0,
                         (AssertionResult *)
                         "EVP_DecryptFinal_ex(decrypt_ctx.get(), out + out_bytes, &final_bytes)",
                         "false","true",in_R9);
              pcVar4 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_3c8,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/blowfish/blowfish_test.cc"
                         ,0x7d,pcVar4);
              testing::internal::AssertHelper::operator=(&local_3c8,&local_3c0);
              testing::internal::AssertHelper::~AssertHelper(&local_3c8);
              std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
              testing::Message::~Message(&local_3c0);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_3b0);
            local_400 = (unsigned_long)(ctx.ctx_._148_4_ + ctx.ctx_.poisoned);
            local_408 = 0x10;
            testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                      ((EqHelper *)local_3f8,"static_cast<size_t>(out_bytes + final_bytes)",
                       "sizeof(test.plaintext)",&local_400,&local_408);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3f8);
            if (!bVar1) {
              testing::Message::Message(&local_410);
              pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_3f8);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/blowfish/blowfish_test.cc"
                         ,0x7f,pcVar4);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_3.message_,&local_410);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
              testing::Message::~Message(&local_410);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_3f8);
            bssl::Span<unsigned_char_const>::Span<16ul>
                      ((Span<unsigned_char_const> *)&local_448,&__end1->plaintext);
            Bytes::Bytes(&local_438,local_448);
            Bytes::Bytes(&local_458,(uint8_t *)&final_bytes,
                         (long)(ctx.ctx_._148_4_ + ctx.ctx_.poisoned));
            testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                      ((EqHelper *)local_428,"Bytes(test.plaintext)",
                       "Bytes(out, out_bytes + final_bytes)",&local_438,&local_458);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_428);
            if (!bVar1) {
              testing::Message::Message(&local_460);
              pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_428);
              testing::internal::AssertHelper::AssertHelper
                        (&local_468,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/blowfish/blowfish_test.cc"
                         ,0x80,pcVar4);
              testing::internal::AssertHelper::operator=(&local_468,&local_460);
              testing::internal::AssertHelper::~AssertHelper(&local_468);
              testing::Message::~Message(&local_460);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_428);
            gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ = 0;
          }
        }
        bssl::internal::
        StackAllocated<evp_cipher_ctx_st,_int,_&EVP_CIPHER_CTX_init,_&EVP_CIPHER_CTX_cleanup>::
        ~StackAllocated((StackAllocated<evp_cipher_ctx_st,_int,_&EVP_CIPHER_CTX_init,_&EVP_CIPHER_CTX_cleanup>
                         *)&gtest_ar__3.message_);
      }
    }
    bssl::internal::
    StackAllocated<evp_cipher_ctx_st,_int,_&EVP_CIPHER_CTX_init,_&EVP_CIPHER_CTX_cleanup>::
    ~StackAllocated((StackAllocated<evp_cipher_ctx_st,_int,_&EVP_CIPHER_CTX_init,_&EVP_CIPHER_CTX_cleanup>
                     *)local_f8);
    testing::ScopedTrace::~ScopedTrace((ScopedTrace *)(out + 0x17));
    if (gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ != 0) break;
    __end1 = __end1 + 1;
  }
  return;
}

Assistant:

TEST(Blowfish, CBC) {
  unsigned test_num = 0;
  for (const auto &test : kTests) {
    test_num++;
    SCOPED_TRACE(test_num);

    uint8_t out[sizeof(test.cbc_ciphertext)];
    int out_bytes, final_bytes;

    bssl::ScopedEVP_CIPHER_CTX ctx;
    ASSERT_TRUE(EVP_EncryptInit_ex(ctx.get(), EVP_bf_cbc(), nullptr, test.key,
                                   test.iv));
    ASSERT_TRUE(EVP_EncryptUpdate(ctx.get(), out, &out_bytes, test.plaintext,
                                  sizeof(test.plaintext)));
    EXPECT_TRUE(EVP_EncryptFinal_ex(ctx.get(), out + out_bytes, &final_bytes));
    EXPECT_EQ(static_cast<size_t>(out_bytes + final_bytes),
              sizeof(test.cbc_ciphertext));
    EXPECT_EQ(Bytes(test.cbc_ciphertext), Bytes(out));

    bssl::ScopedEVP_CIPHER_CTX decrypt_ctx;
    ASSERT_TRUE(EVP_DecryptInit_ex(decrypt_ctx.get(), EVP_bf_cbc(), nullptr,
                                   test.key, test.iv));
    ASSERT_TRUE(EVP_DecryptUpdate(decrypt_ctx.get(), out, &out_bytes,
                                  test.cbc_ciphertext,
                                  sizeof(test.cbc_ciphertext)));
    EXPECT_TRUE(
        EVP_DecryptFinal_ex(decrypt_ctx.get(), out + out_bytes, &final_bytes));
    EXPECT_EQ(static_cast<size_t>(out_bytes + final_bytes),
              sizeof(test.plaintext));
    EXPECT_EQ(Bytes(test.plaintext), Bytes(out, out_bytes + final_bytes));
  }
}